

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Workers.cpp
# Opt level: O0

void __thiscall xmrig::Workers<xmrig::CudaLaunchData>::Workers(Workers<xmrig::CudaLaunchData> *this)

{
  WorkersPrivate *this_00;
  long in_RDI;
  
  std::
  vector<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>
  ::vector((vector<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>
            *)0x1f9d08);
  this_00 = (WorkersPrivate *)operator_new(0x10);
  memset(this_00,0,0x10);
  WorkersPrivate::WorkersPrivate(this_00);
  *(WorkersPrivate **)(in_RDI + 0x18) = this_00;
  return;
}

Assistant:

xmrig::Workers<T>::Workers() :
    d_ptr(new WorkersPrivate())
{

}